

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall autoSimplification_identity2_Test::TestBody(autoSimplification_identity2_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr EVar2;
  AssertHelper local_b8;
  Message local_b0;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ExprPtr e;
  ExprPtr n1;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  ExprPtr u;
  autoSimplification_identity2_Test *this_local;
  
  u.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"u",&local_41);
  mathiu::impl::symbol((impl *)local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  mathiu::impl::operator____i
            ((impl *)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,1);
  EVar2 = mathiu::impl::operator*
                    ((impl *)&gtest_ar.message_,(ExprPtr *)local_20,
                     (ExprPtr *)
                     &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  mathiu::impl::toString_abi_cxx11_
            (&local_a8,(impl *)&gtest_ar.message_,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_88,"toString(e)","\"u\"",&local_a8,(char (*) [2])"u");
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x222,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(autoSimplification, identity2)
{
    auto const u = symbol("u");
    auto const n1 = 1_i;
    auto const e = u * n1;
    EXPECT_EQ(toString(e), "u");
}